

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int MRIStepRootInit(void *arkode_mem,int nrtfn,ARKRootFn g)

{
  uint uVar1;
  long *plVar2;
  void *__ptr;
  void *pvVar3;
  void *pvVar4;
  char *module;
  size_t sVar5;
  char *msgfmt;
  uint uVar6;
  long lVar7;
  int iVar9;
  long lVar10;
  undefined1 auVar8 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::MRIStep","MRIStepRootInit",
                    "arkode_mem = NULL illegal.");
    return -0x15;
  }
  if (arkode_mem == (void *)0x0) {
    module = "ARKode";
    msgfmt = "arkode_mem = NULL illegal.";
    iVar9 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    iVar15 = -0x15;
    goto LAB_003e94cc;
  }
  uVar6 = 0;
  if (0 < nrtfn) {
    uVar6 = nrtfn;
  }
  plVar2 = *(long **)((long)arkode_mem + 0x280);
  if (plVar2 == (long *)0x0) {
    plVar2 = (long *)malloc(0x88);
    *(long **)((long)arkode_mem + 0x280) = plVar2;
    if (plVar2 == (long *)0x0) {
      arkProcessError((ARKodeMem)arkode_mem,0,"ARKode","arkRootInit",
                      "Allocation of arkode_mem failed.");
      return -0x14;
    }
    uVar1 = 0;
    *plVar2 = 0;
    *(undefined4 *)(plVar2 + 1) = 0;
    *(undefined4 *)((long)plVar2 + 100) = 0;
    plVar2[0xe] = 0;
    plVar2[2] = 0;
    plVar2[3] = 0;
    plVar2[7] = 0;
    plVar2[8] = 0;
    plVar2[9] = 0;
    *(undefined4 *)(plVar2 + 0xf) = 1;
    plVar2[0x10] = *(long *)((long)arkode_mem + 0x10);
    lVar7 = *(long *)((long)arkode_mem + 0x218) + 5;
    lVar10 = *(long *)((long)arkode_mem + 0x220) + 0xc;
LAB_003e90ce:
    *(long *)((long)arkode_mem + 0x218) = lVar7;
    *(long *)((long)arkode_mem + 0x220) = lVar10;
  }
  else {
    uVar1 = *(uint *)(plVar2 + 1);
    if (0 < (int)uVar1 && uVar6 != uVar1) {
      free((void *)plVar2[7]);
      lVar7 = *(long *)((long)arkode_mem + 0x280);
      *(undefined8 *)(lVar7 + 0x38) = 0;
      free(*(void **)(lVar7 + 0x40));
      lVar7 = *(long *)((long)arkode_mem + 0x280);
      *(undefined8 *)(lVar7 + 0x40) = 0;
      free(*(void **)(lVar7 + 0x48));
      lVar7 = *(long *)((long)arkode_mem + 0x280);
      *(undefined8 *)(lVar7 + 0x48) = 0;
      free(*(void **)(lVar7 + 0x10));
      lVar7 = *(long *)((long)arkode_mem + 0x280);
      *(undefined8 *)(lVar7 + 0x10) = 0;
      free(*(void **)(lVar7 + 0x18));
      lVar7 = *(long *)((long)arkode_mem + 0x280);
      *(undefined8 *)(lVar7 + 0x18) = 0;
      free(*(void **)(lVar7 + 0x70));
      plVar2 = *(long **)((long)arkode_mem + 0x280);
      plVar2[0xe] = 0;
      uVar1 = *(uint *)(plVar2 + 1);
      lVar7 = (long)(int)uVar1 * 3;
      auVar11._8_4_ = (int)lVar7;
      auVar11._0_8_ = lVar7;
      auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = *(long *)((long)arkode_mem + 0x218) + (long)(int)uVar1 * -3;
      lVar10 = *(long *)((long)arkode_mem + 0x220) - auVar11._8_8_;
      goto LAB_003e90ce;
    }
  }
  if (nrtfn < 1) {
    *(undefined4 *)(plVar2 + 1) = 0;
    *plVar2 = 0;
    return 0;
  }
  if (uVar6 == uVar1) {
    if ((ARKRootFn)*plVar2 == g) {
      return 0;
    }
    if (g != (ARKRootFn)0x0) {
      *plVar2 = (long)g;
      return 0;
    }
    free((void *)plVar2[7]);
    lVar7 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar7 + 0x38) = 0;
    free(*(void **)(lVar7 + 0x40));
    lVar7 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar7 + 0x40) = 0;
    free(*(void **)(lVar7 + 0x48));
    lVar7 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar7 + 0x48) = 0;
    free(*(void **)(lVar7 + 0x10));
    lVar7 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar7 + 0x10) = 0;
    free(*(void **)(lVar7 + 0x18));
    lVar7 = *(long *)((long)arkode_mem + 0x280);
    *(undefined8 *)(lVar7 + 0x18) = 0;
    free(*(void **)(lVar7 + 0x70));
    *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x70) = 0;
    *(ulong *)((long)arkode_mem + 0x218) = *(long *)((long)arkode_mem + 0x218) - (ulong)(uVar6 * 3);
    *(ulong *)((long)arkode_mem + 0x220) = *(long *)((long)arkode_mem + 0x220) - (ulong)(uVar6 * 3);
  }
  else {
    *(uint *)(plVar2 + 1) = uVar6;
    if (g != (ARKRootFn)0x0) {
      *plVar2 = (long)g;
      sVar5 = (ulong)uVar6 * 8;
      __ptr = malloc(sVar5);
      plVar2[7] = (long)__ptr;
      if (__ptr == (void *)0x0) {
LAB_003e94aa:
        module = "ARKode";
      }
      else {
        pvVar3 = malloc(sVar5);
        plVar2[8] = (long)pvVar3;
        if (pvVar3 == (void *)0x0) {
          free(__ptr);
          plVar2[7] = 0;
          goto LAB_003e94aa;
        }
        pvVar3 = malloc(sVar5);
        plVar2[9] = (long)pvVar3;
        if (pvVar3 == (void *)0x0) {
          free(__ptr);
          plVar2[7] = 0;
          free((void *)plVar2[8]);
          *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x40) = 0;
          goto LAB_003e94aa;
        }
        sVar5 = (ulong)uVar6 << 2;
        pvVar3 = malloc(sVar5);
        plVar2[2] = (long)pvVar3;
        if (pvVar3 == (void *)0x0) {
          free(__ptr);
          plVar2[7] = 0;
          free((void *)plVar2[8]);
          lVar7 = *(long *)((long)arkode_mem + 0x280);
          *(undefined8 *)(lVar7 + 0x40) = 0;
          free(*(void **)(lVar7 + 0x48));
          *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x48) = 0;
          goto LAB_003e94aa;
        }
        pvVar3 = malloc(sVar5);
        plVar2[3] = (long)pvVar3;
        if (pvVar3 == (void *)0x0) {
          free(__ptr);
          plVar2[7] = 0;
          free((void *)plVar2[8]);
          lVar7 = *(long *)((long)arkode_mem + 0x280);
          *(undefined8 *)(lVar7 + 0x40) = 0;
          free(*(void **)(lVar7 + 0x48));
          lVar7 = *(long *)((long)arkode_mem + 0x280);
          *(undefined8 *)(lVar7 + 0x48) = 0;
          free(*(void **)(lVar7 + 0x10));
          *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x10) = 0;
          goto LAB_003e94aa;
        }
        pvVar4 = malloc(sVar5);
        plVar2[0xe] = (long)pvVar4;
        if (pvVar4 != (void *)0x0) {
          lVar10 = 0;
          memset(pvVar3,0,(ulong)(uint)nrtfn * 4);
          auVar11 = _DAT_0065b9b0;
          lVar7 = (ulong)(uint)nrtfn - 1;
          auVar8._8_4_ = (int)lVar7;
          auVar8._0_8_ = lVar7;
          auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
          auVar8 = auVar8 ^ _DAT_0065b9b0;
          auVar12 = _DAT_0065f0d0;
          auVar13 = _DAT_0065b9a0;
          do {
            auVar14 = auVar13 ^ auVar11;
            iVar9 = auVar8._4_4_;
            if ((bool)(~(auVar14._4_4_ == iVar9 && auVar8._0_4_ < auVar14._0_4_ ||
                        iVar9 < auVar14._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar4 + lVar10) = 1;
            }
            if ((auVar14._12_4_ != auVar8._12_4_ || auVar14._8_4_ <= auVar8._8_4_) &&
                auVar14._12_4_ <= auVar8._12_4_) {
              *(undefined4 *)((long)pvVar4 + lVar10 + 4) = 1;
            }
            auVar14 = auVar12 ^ auVar11;
            iVar15 = auVar14._4_4_;
            if (iVar15 <= iVar9 && (iVar15 != iVar9 || auVar14._0_4_ <= auVar8._0_4_)) {
              *(undefined4 *)((long)pvVar4 + lVar10 + 8) = 1;
              *(undefined4 *)((long)pvVar4 + lVar10 + 0xc) = 1;
            }
            lVar7 = auVar13._8_8_;
            auVar13._0_8_ = auVar13._0_8_ + 4;
            auVar13._8_8_ = lVar7 + 4;
            lVar7 = auVar12._8_8_;
            auVar12._0_8_ = auVar12._0_8_ + 4;
            auVar12._8_8_ = lVar7 + 4;
            lVar10 = lVar10 + 0x10;
          } while ((ulong)(nrtfn + 3U >> 2) << 4 != lVar10);
          *(ulong *)((long)arkode_mem + 0x218) =
               (ulong)(uVar6 * 3) + *(long *)((long)arkode_mem + 0x218);
          *(ulong *)((long)arkode_mem + 0x220) =
               (ulong)(uVar6 * 3) + *(long *)((long)arkode_mem + 0x220);
          return 0;
        }
        free(__ptr);
        plVar2[7] = 0;
        free((void *)plVar2[8]);
        lVar7 = *(long *)((long)arkode_mem + 0x280);
        *(undefined8 *)(lVar7 + 0x40) = 0;
        free(*(void **)(lVar7 + 0x48));
        lVar7 = *(long *)((long)arkode_mem + 0x280);
        *(undefined8 *)(lVar7 + 0x48) = 0;
        free(*(void **)(lVar7 + 0x10));
        lVar7 = *(long *)((long)arkode_mem + 0x280);
        *(undefined8 *)(lVar7 + 0x10) = 0;
        free(*(void **)(lVar7 + 0x18));
        *(undefined8 *)(*(long *)((long)arkode_mem + 0x280) + 0x18) = 0;
        module = "ARKodeS";
      }
      msgfmt = "A memory request failed.";
      iVar9 = -0x14;
      iVar15 = -0x14;
      goto LAB_003e94cc;
    }
  }
  module = "ARKode";
  msgfmt = "g = NULL illegal.";
  iVar9 = -0x16;
  iVar15 = -0x16;
LAB_003e94cc:
  arkProcessError((ARKodeMem)arkode_mem,iVar15,module,"arkRootInit",msgfmt);
  return iVar9;
}

Assistant:

int MRIStepRootInit(void *arkode_mem, int nrtfn, ARKRootFn g)
{
  /* unpack ark_mem, call arkRootInit, and return */
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::MRIStep",
                    "MRIStepRootInit", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  return(arkRootInit(ark_mem, nrtfn, g));
}